

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O0

uchar __thiscall TextFile::bufGetChar(TextFile *this)

{
  uchar *puVar1;
  ulong uVar2;
  long lVar3;
  TextFile *this_local;
  
  if ((this->fromMemory & 1U) == 0) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= this->bufPos) {
      bufFillRead(this);
      lVar3 = std::__cxx11::string::size();
      if (lVar3 == 0) {
        return '\0';
      }
    }
    this->contentPos = this->contentPos + 1;
    this->bufPos = this->bufPos + 1;
    puVar1 = (uchar *)std::__cxx11::string::operator[]((ulong)&this->buf);
    this_local._7_1_ = *puVar1;
  }
  else {
    this->contentPos = this->contentPos + 1;
    puVar1 = (uchar *)std::__cxx11::string::operator[]((ulong)&this->content);
    this_local._7_1_ = *puVar1;
  }
  return this_local._7_1_;
}

Assistant:

inline unsigned char bufGetChar()
	{
		if (fromMemory)
			return content[contentPos++];

		if (buf.size() <= bufPos)
		{
			bufFillRead();
			if (buf.size() == 0)
				return 0;
		}
		++contentPos;
		return buf[bufPos++];
	}